

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  PendingList *pPVar6;
  long lVar7;
  PendingList *pOld;
  u64 nBytes;
  
  pOld = *pp;
  if (pOld == (PendingList *)0x0) {
    iVar5 = sqlite3_initialize();
    if (iVar5 != 0) {
      return 7;
    }
    pOld = (PendingList *)sqlite3Malloc(0x94);
    if (pOld == (PendingList *)0x0) {
      return 7;
    }
    pOld->nSpace = 100;
    pPVar6 = pOld + 1;
    pOld->aData = (char *)pPVar6;
    pOld->nData = 0;
    iVar5 = 0;
  }
  else {
    iVar5 = pOld->nData;
    iVar2 = pOld->nSpace;
    if (iVar2 < iVar5 + 0xb) {
      iVar5 = sqlite3_initialize();
      if (iVar5 == 0) {
        iVar2 = iVar2 * 2;
        uVar1 = iVar2 + 0x30;
        nBytes = 0;
        if (0 < (int)uVar1) {
          nBytes = (u64)uVar1;
        }
        pOld = (PendingList *)sqlite3Realloc(pOld,nBytes);
        if (pOld != (PendingList *)0x0) {
          pOld->nSpace = iVar2;
          pPVar6 = pOld + 1;
          pOld->aData = (char *)pPVar6;
          iVar5 = pOld->nData;
          goto LAB_001c0f96;
        }
      }
      sqlite3_free(*pp);
      iVar5 = 7;
      pOld = (PendingList *)0x0;
      goto LAB_001c0fd7;
    }
    pPVar6 = (PendingList *)pOld->aData;
  }
LAB_001c0f96:
  lVar7 = 0;
  do {
    bVar4 = (byte)i;
    *(byte *)((long)&pPVar6->nData + lVar7 + iVar5) = bVar4 | 0x80;
    lVar7 = lVar7 + 1;
    bVar3 = 0x7f < (ulong)i;
    i = (ulong)i >> 7;
  } while (bVar3);
  *(byte *)((long)&pPVar6->nData + lVar7 + (long)iVar5 + -1) = bVar4;
  iVar5 = pOld->nData;
  pOld->nData = iVar5 + (int)lVar7;
  pOld->aData[lVar7 + iVar5] = '\0';
  iVar5 = 0;
LAB_001c0fd7:
  *pp = pOld;
  return iVar5;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    int nNew = p->nSpace * 2;
    p = sqlite3_realloc(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}